

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O3

Point2f __thiscall pbrt::HaltonSampler::Get2D(HaltonSampler *this)

{
  DigitPermutation *pDVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  Tuple2<pbrt::Point2,_float> TVar11;
  float fVar12;
  float fVar13;
  undefined1 in_ZMM4 [64];
  undefined1 in_XMM5 [16];
  
  iVar5 = this->dimension;
  if (iVar5 != 0) {
    iVar6 = 2;
    if (iVar5 < 999) {
      iVar6 = iVar5;
    }
    lVar10 = 0;
    iVar5 = 0;
    this->dimension = iVar6 + 2;
    uVar4 = (this->haltonPixelIndexer).sampleIndex;
    lVar7 = (long)iVar6;
    uVar9 = (ulong)(int)(&Primes)[lVar7];
    pDVar1 = this->digitPermutations->ptr;
    fVar12 = 1.0;
    uVar8 = uVar4;
    do {
      iVar6 = iVar5 * pDVar1[lVar7].base;
      fVar12 = (1.0 / (float)(int)(&Primes)[lVar7]) * fVar12;
      iVar5 = iVar5 + 1;
      lVar10 = (ulong)pDVar1[lVar7].permutations[iVar6 + (int)(uVar8 % uVar9)] + lVar10 * uVar9;
      uVar8 = uVar8 / uVar9;
    } while (1.0 - fVar12 < 1.0);
    auVar2 = vcvtusi2ss_avx512f(in_ZMM4._0_16_,lVar10);
    fVar13 = 1.0;
    uVar8 = (ulong)(int)(&DAT_02d25894)[lVar7];
    lVar10 = 0;
    iVar5 = 0;
    do {
      iVar6 = iVar5 * pDVar1[lVar7 + 1].base;
      fVar13 = (1.0 / (float)(int)(&DAT_02d25894)[lVar7]) * fVar13;
      iVar5 = iVar5 + 1;
      lVar10 = (ulong)pDVar1[lVar7 + 1].permutations[iVar6 + (int)(uVar4 % uVar8)] + lVar10 * uVar8;
      uVar4 = uVar4 / uVar8;
    } while (1.0 - fVar13 < 1.0);
    auVar2 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),ZEXT416((uint)(fVar12 * auVar2._0_4_)));
    auVar3 = vcvtusi2ss_avx512f(in_XMM5,lVar10);
    auVar3 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),ZEXT416((uint)(fVar13 * auVar3._0_4_)));
    auVar2 = vinsertps_avx(auVar2,auVar3,0x10);
    return (Point2f)auVar2._0_8_;
  }
  this->dimension = 2;
  TVar11 = (Tuple2<pbrt::Point2,_float>)HaltonPixelIndexer::SampleFirst2D(&this->haltonPixelIndexer)
  ;
  return (Point2f)TVar11;
}

Assistant:

PBRT_CPU_GPU
    Point2f Get2D() {
        if (dimension == 0) {
            dimension += 2;
            return haltonPixelIndexer.SampleFirst2D();
        } else {
            if (dimension + 1 >= PrimeTableSize)
                dimension = 2;

            int dim = dimension;
            dimension += 2;
            return {ScrambledRadicalInverse(dim, haltonPixelIndexer.SampleIndex(),
                                            (*digitPermutations)[dim]),
                    ScrambledRadicalInverse(dim + 1, haltonPixelIndexer.SampleIndex(),
                                            (*digitPermutations)[dim + 1])};
        }
    }